

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS ref_cavity_add_tri(REF_CAVITY ref_cavity,REF_INT tri)

{
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_INT *pRVar1;
  REF_INT *pRVar2;
  uint uVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  REF_INT already_have_it;
  REF_INT all_local;
  long local_48;
  REF_INT seg_nodes [3];
  
  if (-1 < tri) {
    ref_cell = ref_cavity->ref_grid->cell[3];
    if ((tri < ref_cell->max) && (ref_cell->c2n[(long)ref_cell->size_per * (long)tri] != -1)) {
      ref_node = ref_cavity->ref_grid->node;
      uVar3 = ref_list_contains(ref_cavity->tri_list,tri,&already_have_it);
      if (uVar3 == 0) {
        if (already_have_it != 0) {
          return 0;
        }
        uVar3 = ref_cell_all_local(ref_cell,ref_node,tri,&all_local);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x216,"ref_cavity_add_tri",(ulong)uVar3,"local cell");
          return uVar3;
        }
        if (all_local == 0) {
          ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
          return 0;
        }
        uVar3 = ref_list_push(ref_cavity->tri_list,tri);
        if (uVar3 == 0) {
          local_48 = 0;
          lVar8 = 0;
          while( true ) {
            if (ref_cell->edge_per <= lVar8) {
              return 0;
            }
            pRVar1 = ref_cell->c2n;
            lVar4 = (long)ref_cell->size_per * (long)tri;
            pRVar2 = ref_cell->e2n;
            for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
              seg_nodes[lVar6] = pRVar1[*(int *)((long)pRVar2 + lVar6 * 4 + local_48) + lVar4];
            }
            seg_nodes[2] = pRVar1[(long)(int)lVar4 + (long)ref_cell->node_per];
            uVar3 = ref_cavity_insert_seg(ref_cavity,seg_nodes);
            if (uVar3 != 0) break;
            lVar8 = lVar8 + 1;
            local_48 = local_48 + 8;
            if (ref_cavity->state != REF_CAVITY_UNKNOWN) {
              return 0;
            }
          }
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x223,"ref_cavity_add_tri",(ulong)uVar3,"tri side");
          return uVar3;
        }
        pcVar7 = "save tri";
        uVar5 = 0x21c;
      }
      else {
        pcVar7 = "have tri?";
        uVar5 = 0x213;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             uVar5,"ref_cavity_add_tri",(ulong)uVar3,pcVar7);
      return uVar3;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x210,
         "ref_cavity_add_tri","invalid tri");
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_add_tri(REF_CAVITY ref_cavity, REF_INT tri) {
  REF_CELL ref_cell = ref_grid_tri(ref_cavity_grid(ref_cavity));
  REF_NODE ref_node = ref_grid_node(ref_cavity_grid(ref_cavity));
  REF_INT cell_edge, node;
  REF_INT seg_nodes[3];
  REF_INT all_local, already_have_it;

  RAS(ref_cell_valid(ref_cell, tri), "invalid tri");

  RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), tri, &already_have_it),
      "have tri?");
  if (already_have_it) return REF_SUCCESS;

  RSS(ref_cell_all_local(ref_cell, ref_node, tri, &all_local), "local cell");
  if (!all_local) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), tri), "save tri");

  each_ref_cell_cell_edge(ref_cell, cell_edge) {
    each_ref_cavity_seg_node(ref_cavity, node) {
      seg_nodes[node] = ref_cell_e2n(ref_cell, node, cell_edge, tri);
    }
    seg_nodes[2] = ref_cell_c2n(ref_cell, ref_cell_node_per(ref_cell), tri);
    RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    if (REF_CAVITY_UNKNOWN != ref_cavity_state(ref_cavity)) return REF_SUCCESS;
  }

  return REF_SUCCESS;
}